

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O2

void __thiscall
boost::ext::di::v1_3_0::core::
injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,boost::ext::di::v1_3_0::aux::type_list<complex1,i1>,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,complex1>,boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,std::shared_ptr<i1>>>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>
::
injector<boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,i1,impl1,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,boost::ext::di::v1_3_0::aux::type_list<complex1,i1>,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,complex1>,boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,std::shared_ptr<i1>>>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>
          (injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,boost::ext::di::v1_3_0::aux::type_list<complex1,i1>,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,complex1>,boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,std::shared_ptr<i1>>>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>
           *this,from_injector *param_1,
          injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
          *injector,
          type_list<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::aux::type_list<complex1,_i1>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_complex1>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::shared_ptr<i1>_>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
          *param_3)

{
  type_list<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::aux::type_list<complex1,_i1>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_complex1>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::shared_ptr<i1>_>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  local_29;
  scope<boost::ext::di::v1_3_0::aux::type_list<complex1,_i1>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_complex1>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::shared_ptr<i1>_>_>,_int>
  local_28;
  scope<boost::ext::di::v1_3_0::aux::type_list<complex1,_i1>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_complex1>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::shared_ptr<i1>_>_>,_int>
  local_20;
  
  scopes::instance::
  scope<boost::ext::di::v1_3_0::aux::type_list<complex1,_i1>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_complex1>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::shared_ptr<i1>_>_>,_int>
  ::
  scope<boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>,_0>
            (&local_28,injector);
  local_20.injector_ = local_28.injector_;
  local_28.injector_ = (injector *)0x0;
  pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,boost::ext::di::v1_3_0::aux::type_list<complex1,i1>,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,complex1>,boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,std::shared_ptr<i1>>>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>
  ::
  pool<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,boost::ext::di::v1_3_0::aux::type_list<complex1,i1>,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,complex1>,boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,std::shared_ptr<i1>>>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,boost::ext::di::v1_3_0::aux::type_list<complex1,i1>,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,complex1>,boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,std::shared_ptr<i1>>>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>>
            ((pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,boost::ext::di::v1_3_0::aux::type_list<complex1,i1>,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,complex1>,boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,std::shared_ptr<i1>>>,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>
              *)this,&local_29,
             (pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::aux::type_list<complex1,_i1>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_complex1>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::shared_ptr<i1>_>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
              *)&local_20);
  scopes::instance::
  scope<boost::ext::di::v1_3_0::aux::type_list<complex1,_i1>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_complex1>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::shared_ptr<i1>_>_>,_int>
  ::~scope(&local_20);
  scopes::instance::
  scope<boost::ext::di::v1_3_0::aux::type_list<complex1,_i1>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_complex1>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::shared_ptr<i1>_>_>,_int>
  ::~scope(&local_28);
  return;
}

Assistant:

pool_t{bindings_t<TArgs...>{},
               pool_t {
                 build<TArgs>(static_cast<TInjector&&>(injector))...
               }}
#else
      : pool_t{bindings_t<TArgs...>{},
               pool_t {
                 TArgs{static_cast<TInjector&&>(injector)}...
               }}
#endif
  {
  }